

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode set_login(connectdata *conn,char *user,char *passwd,char *options)

{
  CURLcode CVar1;
  char *pcVar2;
  
  if (((conn->handler->flags & 0x20) == 0) || ((conn->bits).user_passwd != false)) {
    pcVar2 = (*Curl_cstrdup)(user);
    conn->user = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)(passwd);
      goto LAB_0011bed6;
    }
  }
  else {
    pcVar2 = (*Curl_cstrdup)("anonymous");
    conn->user = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)("ftp@example.com");
      goto LAB_0011bed6;
    }
  }
  pcVar2 = (char *)0x0;
LAB_0011bed6:
  conn->passwd = pcVar2;
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (pcVar2 != (char *)0x0 && conn->user != (char *)0x0) {
    if (*options == '\0') {
      CVar1 = CURLE_OK;
    }
    else {
      pcVar2 = (*Curl_cstrdup)(options);
      conn->options = pcVar2;
      CVar1 = CURLE_OUT_OF_MEMORY;
      if (pcVar2 != (char *)0x0) {
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode set_login(struct connectdata *conn,
                          const char *user, const char *passwd,
                          const char *options)
{
  CURLcode result = CURLE_OK;

  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) && !conn->bits.user_passwd) {
    /* Store the default user */
    conn->user = strdup(CURL_DEFAULT_USER);

    /* Store the default password */
    if(conn->user)
      conn->passwd = strdup(CURL_DEFAULT_PASSWORD);
    else
      conn->passwd = NULL;

    /* This is the default password, so DON'T set conn->bits.user_passwd */
  }
  else {
    /* Store the user, zero-length if not set */
    conn->user = strdup(user);

    /* Store the password (only if user is present), zero-length if not set */
    if(conn->user)
      conn->passwd = strdup(passwd);
    else
      conn->passwd = NULL;
  }

  if(!conn->user || !conn->passwd)
    result = CURLE_OUT_OF_MEMORY;

  /* Store the options, null if not set */
  if(!result && options[0]) {
    conn->options = strdup(options);

    if(!conn->options)
      result = CURLE_OUT_OF_MEMORY;
  }

  return result;
}